

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toucs.c
# Opt level: O0

void unicode_emit(void *ctx,long output)

{
  undefined4 uVar1;
  undefined4 *puVar2;
  int local_34;
  undefined4 *puStack_30;
  wchar_t outlen;
  wchar_t *p;
  wchar_t outval;
  unicode_emit_param *param;
  long output_local;
  void *ctx_local;
  
  if (output == 0xffff) {
    if (*(long *)((long)ctx + 0x10) == 0) {
      puStack_30 = (undefined4 *)((long)&p + 4);
      local_34 = 1;
    }
    else {
      puStack_30 = *(undefined4 **)((long)ctx + 0x10);
      local_34 = *(int *)((long)ctx + 0x18);
    }
  }
  else {
    puStack_30 = (undefined4 *)((long)&p + 4);
    local_34 = 1;
  }
  if (*(int *)((long)ctx + 8) < local_34) {
    *(undefined4 *)((long)ctx + 0x1c) = 1;
  }
  else {
    for (; 0 < local_34; local_34 = local_34 + -1) {
      uVar1 = *puStack_30;
      puVar2 = *ctx;
      *(undefined4 **)ctx = puVar2 + 1;
      *puVar2 = uVar1;
      *(int *)((long)ctx + 8) = *(int *)((long)ctx + 8) + -1;
      puStack_30 = puStack_30 + 1;
    }
  }
  return;
}

Assistant:

static void unicode_emit(void *ctx, long int output)
{
    struct unicode_emit_param *param = (struct unicode_emit_param *)ctx;
    wchar_t outval;
    wchar_t const *p;
    int outlen;

    if (output == ERROR) {
        if (param->errstr) {
            p = param->errstr;
            outlen = param->errlen;
        } else {
            outval = 0xFFFD;           /* U+FFFD REPLACEMENT CHARACTER */
            p = &outval;
            outlen = 1;
        }
    } else {
        outval = output;
        p = &outval;
        outlen = 1;
    }

    if (param->outlen >= outlen) {
        while (outlen > 0) {
            *param->output++ = *p++;
            param->outlen--;
            outlen--;
        }
    } else {
        param->stopped = 1;
    }
}